

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O2

int Aig_NodeCompareLevelsDecrease(Aig_Obj_t **pp1,Aig_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = Aig_ObjLevel((Aig_Obj_t *)((ulong)*pp1 & 0xfffffffffffffffe));
  iVar2 = Aig_ObjLevel((Aig_Obj_t *)((ulong)*pp2 & 0xfffffffffffffffe));
  uVar3 = 0xffffffff;
  if (iVar1 <= iVar2) {
    if (iVar1 - iVar2 < 0) {
      uVar3 = 1;
    }
    else {
      iVar1 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 0x24);
      iVar2 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 0x24);
      if (iVar2 <= iVar1) {
        uVar3 = (uint)(iVar2 != iVar1);
      }
    }
  }
  return uVar3;
}

Assistant:

int Aig_NodeCompareLevelsDecrease( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 )
{
    int Diff = Aig_ObjLevel(Aig_Regular(*pp1)) - Aig_ObjLevel(Aig_Regular(*pp2));
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    Diff = Aig_ObjId(Aig_Regular(*pp1)) - Aig_ObjId(Aig_Regular(*pp2));
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    return 0; 
}